

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> __thiscall
helics::make_filter(helics *this,FilterTypes type,CoreApp *core,string_view name)

{
  string_view name_00;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  name_00._M_str = (char *)name._M_len;
  CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)core);
  name_00._M_len = (size_t)local_38._M_ptr;
  make_filter((FilterTypes)this,(Core *)(ulong)type,name_00);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Filter> make_filter(FilterTypes type, CoreApp& core, std::string_view name)
{
    return make_filter(type, core.getCopyofCorePointer().get(), name);
}